

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

roaring64_bitmap_t * roaring64_bitmap_xor(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  leaf_t leaf;
  leaf_t leaf_00;
  _Bool _Var1;
  roaring64_bitmap_t *prVar2;
  bool bVar3;
  bool bVar4;
  leaf_t result_leaf_2;
  leaf_t result_leaf_1;
  leaf_t result_leaf;
  container_t *result_container;
  uint8_t result_typecode;
  leaf_t leaf2;
  leaf_t leaf1;
  int compare_result;
  _Bool it2_present;
  _Bool it1_present;
  art_iterator_t it2;
  art_iterator_t it1;
  roaring64_bitmap_t *result;
  art_key_chunk_t *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  uint8_t in_stack_fffffffffffffe77;
  roaring64_bitmap_t *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  uint8_t type2;
  container_t *in_stack_fffffffffffffe88;
  leaf_t in_stack_fffffffffffffe90;
  container_t *in_stack_fffffffffffffe98;
  int local_140;
  leaf_t *local_130;
  leaf_t *local_a0;
  
  prVar2 = roaring64_bitmap_create();
  art_init_iterator((art_t *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                    SUB81((ulong)in_stack_fffffffffffffe78 >> 0x38,0));
  art_init_iterator((art_t *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                    SUB81((ulong)in_stack_fffffffffffffe78 >> 0x38,0));
  while (type2 = local_a0 != (leaf_t *)0x0 || local_130 != (leaf_t *)0x0,
        local_a0 != (leaf_t *)0x0 || local_130 != (leaf_t *)0x0) {
    bVar3 = local_a0 != (leaf_t *)0x0;
    bVar4 = local_130 != (leaf_t *)0x0;
    local_140 = 0;
    if (((bVar3) && (bVar4)) &&
       (local_140 = compare_high48((art_key_chunk_t *)
                                   CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                                   in_stack_fffffffffffffe68), local_140 == 0)) {
      leaf = *local_a0;
      leaf_00 = *local_130;
      in_stack_fffffffffffffe68 =
           (art_key_chunk_t *)
           get_container((roaring64_bitmap_t *)
                         CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                         (leaf_t)in_stack_fffffffffffffe68);
      in_stack_fffffffffffffe77 = get_typecode(leaf);
      in_stack_fffffffffffffe78 =
           (roaring64_bitmap_t *)
           get_container((roaring64_bitmap_t *)
                         CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                         (leaf_t)in_stack_fffffffffffffe68);
      get_typecode(leaf_00);
      container_xor(in_stack_fffffffffffffe98,(uint8_t)(in_stack_fffffffffffffe90 >> 0x38),
                    in_stack_fffffffffffffe88,type2,(uint8_t *)in_stack_fffffffffffffe78);
      _Var1 = container_nonzero_cardinality(in_stack_fffffffffffffe68,'\0');
      if (_Var1) {
        in_stack_fffffffffffffe98 =
             (container_t *)
             add_container((roaring64_bitmap_t *)CONCAT17(type2,in_stack_fffffffffffffe80),
                           in_stack_fffffffffffffe78,in_stack_fffffffffffffe77);
        art_insert(&in_stack_fffffffffffffe78->art,
                   (art_key_chunk_t *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                   (art_val_t)in_stack_fffffffffffffe68);
      }
      else {
        container_free((container_t *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                       (uint8_t)((ulong)in_stack_fffffffffffffe68 >> 0x38));
      }
      art_iterator_next((art_iterator_t *)0x121e2d);
      art_iterator_next((art_iterator_t *)0x121e37);
    }
    if (((bVar3) && (!bVar4)) || (local_140 < 0)) {
      in_stack_fffffffffffffe90 =
           copy_leaf_container((roaring64_bitmap_t *)CONCAT17(type2,in_stack_fffffffffffffe80),
                               in_stack_fffffffffffffe78,
                               CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
      art_insert(&in_stack_fffffffffffffe78->art,
                 (art_key_chunk_t *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                 (art_val_t)in_stack_fffffffffffffe68);
      art_iterator_next((art_iterator_t *)0x121e9a);
    }
    else if (((!bVar3) && (bVar4)) || (0 < local_140)) {
      in_stack_fffffffffffffe88 =
           (container_t *)
           copy_leaf_container((roaring64_bitmap_t *)CONCAT17(type2,in_stack_fffffffffffffe80),
                               in_stack_fffffffffffffe78,
                               CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
      art_insert(&in_stack_fffffffffffffe78->art,
                 (art_key_chunk_t *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                 (art_val_t)in_stack_fffffffffffffe68);
      art_iterator_next((art_iterator_t *)0x121ef4);
    }
  }
  return prVar2;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_xor(const roaring64_bitmap_t *r1,
                                         const roaring64_bitmap_t *r2) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it1 = art_init_iterator((art_t *)&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator((art_t *)&r2->art, /*first=*/true);

    while (it1.value != NULL || it2.value != NULL) {
        bool it1_present = it1.value != NULL;
        bool it2_present = it2.value != NULL;

        // Cases:
        // 1. it1_present  && !it2_present -> output it1, it1++
        // 2. !it1_present && it2_present  -> output it2, it2++
        // 3. it1_present  && it2_present
        //    a. it1 <  it2 -> output it1, it1++
        //    b. it1 == it2 -> output it1 ^ it2, it1++, it2++
        //    c. it1 >  it2 -> output it2, it2++
        int compare_result = 0;
        if (it1_present && it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 3b: iterators at the same high key position.
                leaf_t leaf1 = (leaf_t)*it1.value;
                leaf_t leaf2 = (leaf_t)*it2.value;
                uint8_t result_typecode;
                container_t *result_container =
                    container_xor(get_container(r1, leaf1), get_typecode(leaf1),
                                  get_container(r2, leaf2), get_typecode(leaf2),
                                  &result_typecode);
                if (container_nonzero_cardinality(result_container,
                                                  result_typecode)) {
                    leaf_t result_leaf = add_container(result, result_container,
                                                       result_typecode);
                    art_insert(&result->art, it1.key, (art_val_t)result_leaf);
                } else {
                    container_free(result_container, result_typecode);
                }
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if ((it1_present && !it2_present) || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            leaf_t result_leaf =
                copy_leaf_container(r1, result, (leaf_t)*it1.value);
            art_insert(&result->art, it1.key, (art_val_t)result_leaf);
            art_iterator_next(&it1);
        } else if ((!it1_present && it2_present) || compare_result > 0) {
            // Cases 2 and 3c: it2 is the only iterator or is before it1.
            leaf_t result_leaf =
                copy_leaf_container(r2, result, (leaf_t)*it2.value);
            art_insert(&result->art, it2.key, (art_val_t)result_leaf);
            art_iterator_next(&it2);
        }
    }
    return result;
}